

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint8_t uVar1;
  char *__s;
  bool bVar2;
  uint16_t uVar3;
  ostream *poVar4;
  type pIVar5;
  reference pPVar6;
  uint8_t *puVar7;
  pointer pIVar8;
  deque<ixy::Packet,_std::allocator<ixy::Packet>_> *pdVar9;
  uint64_t time;
  Packet *p_1;
  iterator __end2;
  iterator __begin2;
  deque<ixy::Packet,_std::allocator<ixy::Packet>_> *__range2;
  uint64_t last_stats_printed;
  ulong uStack_1b8;
  uint32_t seq_num;
  uint64_t counter;
  deque<ixy::Packet,_std::allocator<ixy::Packet>_> buffer;
  device_stats stats1_old;
  device_stats stats1;
  uint16_t checksum;
  uint8_t i;
  Packet *p;
  iterator __end1;
  iterator __begin1;
  deque<ixy::Packet,_std::allocator<ixy::Packet>_> *__range1;
  deque<ixy::Packet,_std::allocator<ixy::Packet>_> buffer_1;
  shared_ptr<ixy::Mempool> pool;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  unique_ptr<ixy::IxyDevice,_std::default_delete<ixy::IxyDevice>_> dev;
  char **argv_local;
  int argc_local;
  
  dev._M_t.super___uniq_ptr_impl<ixy::IxyDevice,_std::default_delete<ixy::IxyDevice>_>._M_t.
  super__Tuple_impl<0UL,_ixy::IxyDevice_*,_std::default_delete<ixy::IxyDevice>_>.
  super__Head_base<0UL,_ixy::IxyDevice_*,_false>._M_head_impl =
       (__uniq_ptr_data<ixy::IxyDevice,_std::default_delete<ixy::IxyDevice>,_true,_true>)
       (__uniq_ptr_data<ixy::IxyDevice,_std::default_delete<ixy::IxyDevice>,_true,_true>)argv;
  if (argc == 2) {
    __s = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_40,__s,&local_41);
    ixy::ixy_init((string *)local_20,(uint16_t)local_40,1);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
    ixy::Mempool::allocate
              ((Mempool *)
               &buffer_1.super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node,0x800,0);
    std::deque<ixy::Packet,_std::allocator<ixy::Packet>_>::deque
              ((deque<ixy::Packet,_std::allocator<ixy::Packet>_> *)&__range1);
    ixy::Mempool::alloc_pkt_batch
              ((shared_ptr<ixy::Mempool> *)
               &buffer_1.super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node,
               (deque<ixy::Packet,_std::allocator<ixy::Packet>_> *)&__range1,0x800,0x3c);
    std::deque<ixy::Packet,_std::allocator<ixy::Packet>_>::begin
              ((iterator *)&__end1._M_node,
               (deque<ixy::Packet,_std::allocator<ixy::Packet>_> *)&__range1);
    std::deque<ixy::Packet,_std::allocator<ixy::Packet>_>::end
              ((iterator *)&p,(deque<ixy::Packet,_std::allocator<ixy::Packet>_> *)&__range1);
    while (bVar2 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&p), bVar2) {
      pPVar6 = std::_Deque_iterator<ixy::Packet,_ixy::Packet_&,_ixy::Packet_*>::operator*
                         ((_Deque_iterator<ixy::Packet,_ixy::Packet_&,_ixy::Packet_*> *)
                          &__end1._M_node);
      for (stats1.tx_bytes._7_1_ = 0; stats1.tx_bytes._7_1_ < 0x2d;
          stats1.tx_bytes._7_1_ = stats1.tx_bytes._7_1_ + 1) {
        uVar1 = "\x01\x02\x03\x04\x05\x06\x10\x10\x10\x10\x10\x10\b"[stats1.tx_bytes._7_1_];
        puVar7 = ixy::Packet::at(pPVar6,(ulong)stats1.tx_bytes._7_1_);
        *puVar7 = uVar1;
      }
      puVar7 = ixy::Packet::get_virt_addr(pPVar6);
      uVar3 = calc_ip_checksum(puVar7 + 0xe,0x14);
      stats1.tx_bytes._5_1_ = (uint8_t)(uVar3 >> 8);
      puVar7 = ixy::Packet::at(pPVar6,0x18);
      *puVar7 = stats1.tx_bytes._5_1_;
      stats1.tx_bytes._4_1_ = (uint8_t)uVar3;
      puVar7 = ixy::Packet::at(pPVar6,0x19);
      *puVar7 = stats1.tx_bytes._4_1_;
      std::_Deque_iterator<ixy::Packet,_ixy::Packet_&,_ixy::Packet_*>::operator++
                ((_Deque_iterator<ixy::Packet,_ixy::Packet_&,_ixy::Packet_*> *)&__end1._M_node);
    }
    std::deque<ixy::Packet,_std::allocator<ixy::Packet>_>::~deque
              ((deque<ixy::Packet,_std::allocator<ixy::Packet>_> *)&__range1);
    pIVar5 = std::unique_ptr<ixy::IxyDevice,_std::default_delete<ixy::IxyDevice>_>::operator*
                       ((unique_ptr<ixy::IxyDevice,_std::default_delete<ixy::IxyDevice>_> *)local_20
                       );
    ixy::device_stats::device_stats((device_stats *)&stats1_old.tx_bytes,pIVar5);
    pIVar5 = std::unique_ptr<ixy::IxyDevice,_std::default_delete<ixy::IxyDevice>_>::operator*
                       ((unique_ptr<ixy::IxyDevice,_std::default_delete<ixy::IxyDevice>_> *)local_20
                       );
    ixy::device_stats::device_stats
              ((device_stats *)
               &buffer.super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node,pIVar5);
    std::deque<ixy::Packet,_std::allocator<ixy::Packet>_>::deque
              ((deque<ixy::Packet,_std::allocator<ixy::Packet>_> *)&counter);
    uStack_1b8 = 0;
    last_stats_printed._4_4_ = 0;
    __range2 = (deque<ixy::Packet,_std::allocator<ixy::Packet>_> *)ixy::monotonic_time();
    do {
      ixy::Mempool::alloc_pkt_batch
                ((shared_ptr<ixy::Mempool> *)
                 &buffer_1.super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node,
                 (deque<ixy::Packet,_std::allocator<ixy::Packet>_> *)&counter,0x20,0x3c);
      std::deque<ixy::Packet,_std::allocator<ixy::Packet>_>::begin
                ((iterator *)&__end2._M_node,
                 (deque<ixy::Packet,_std::allocator<ixy::Packet>_> *)&counter);
      std::deque<ixy::Packet,_std::allocator<ixy::Packet>_>::end
                ((iterator *)&p_1,(deque<ixy::Packet,_std::allocator<ixy::Packet>_> *)&counter);
      while (bVar2 = std::operator!=((_Self *)&__end2._M_node,(_Self *)&p_1), bVar2) {
        pPVar6 = std::_Deque_iterator<ixy::Packet,_ixy::Packet_&,_ixy::Packet_*>::operator*
                           ((_Deque_iterator<ixy::Packet,_ixy::Packet_&,_ixy::Packet_*> *)
                            &__end2._M_node);
        puVar7 = ixy::Packet::get_virt_addr(pPVar6);
        *(int *)(puVar7 + 0x38) = last_stats_printed._4_4_;
        std::_Deque_iterator<ixy::Packet,_ixy::Packet_&,_ixy::Packet_*>::operator++
                  ((_Deque_iterator<ixy::Packet,_ixy::Packet_&,_ixy::Packet_*> *)&__end2._M_node);
        last_stats_printed._4_4_ = last_stats_printed._4_4_ + 1;
      }
      pIVar8 = std::unique_ptr<ixy::IxyDevice,_std::default_delete<ixy::IxyDevice>_>::operator->
                         ((unique_ptr<ixy::IxyDevice,_std::default_delete<ixy::IxyDevice>_> *)
                          local_20);
      (*pIVar8->_vptr_IxyDevice[7])(pIVar8,0,&counter);
      if (((uStack_1b8 & 0xfff) == 0) &&
         (pdVar9 = (deque<ixy::Packet,_std::allocator<ixy::Packet>_> *)ixy::monotonic_time(),
         1000000000 < (ulong)((long)pdVar9 - (long)__range2))) {
        pIVar8 = std::unique_ptr<ixy::IxyDevice,_std::default_delete<ixy::IxyDevice>_>::operator->
                           ((unique_ptr<ixy::IxyDevice,_std::default_delete<ixy::IxyDevice>_> *)
                            local_20);
        (*pIVar8->_vptr_IxyDevice[8])(pIVar8,&stats1_old.tx_bytes);
        ixy::device_stats::print_stats_diff
                  ((device_stats *)
                   &buffer.super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node,(device_stats *)&stats1_old.tx_bytes,
                   (long)pdVar9 - (long)__range2);
        ixy::device_stats::operator=
                  ((device_stats *)
                   &buffer.super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node,(device_stats *)&stats1_old.tx_bytes);
        __range2 = pdVar9;
      }
      std::deque<ixy::Packet,_std::allocator<ixy::Packet>_>::clear
                ((deque<ixy::Packet,_std::allocator<ixy::Packet>_> *)&counter);
      uStack_1b8 = uStack_1b8 + 1;
    } while( true );
  }
  poVar4 = std::operator<<((ostream *)&std::cout,*argv);
  poVar4 = std::operator<<(poVar4," generates packets on a single port.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar4 = std::operator<<(poVar4,*(char **)dev._M_t.
                                            super___uniq_ptr_impl<ixy::IxyDevice,_std::default_delete<ixy::IxyDevice>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_ixy::IxyDevice_*,_std::default_delete<ixy::IxyDevice>_>
                                            .super__Head_base<0UL,_ixy::IxyDevice_*,_false>.
                                            _M_head_impl);
  poVar4 = std::operator<<(poVar4," <pci bus id1>");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return 1;
}

Assistant:

auto main(int argc, char *argv[]) -> int {
    if (argc != 2) {
        std::cout << argv[0] << " generates packets on a single port." << std::endl;
        std::cout << "Usage: " << argv[0] << " <pci bus id1>" << std::endl;
        return 1;
    }

    auto dev = ixy_init(argv[1], 1, 1);

    auto pool = Mempool::allocate(NUM_PACKETS, 0);

    // pre-fill all packet buffer in the pool with data and return them to the packet pool
    {
        std::deque<Packet> buffer;

        Mempool::alloc_pkt_batch(pool, buffer, NUM_PACKETS, PACKET_SIZE);

        for (auto &p : buffer) {
            for (uint8_t i = 0; i < sizeof(pkt_data); i++) {
                p.at(i) = pkt_data[i];
            }

            auto checksum = calc_ip_checksum(p.get_virt_addr() + 14, 20);

            p.at(24) = (checksum >> 8);
            p.at(25) = (checksum & 0xff);
        }
    }

    struct device_stats stats1{*dev}, stats1_old{*dev};

    std::deque<Packet> buffer;
    uint64_t counter = 0;
    uint32_t seq_num = 0;

    auto last_stats_printed = monotonic_time();

    while (true) {
        // re-fill our packet queue with new packets to send out
        Mempool::alloc_pkt_batch(pool, buffer, BATCH_SIZE, PACKET_SIZE);

        // update sequence number of all packets (and checksum if necessary)
        for (auto &p : buffer) {
            *(uint32_t *) (p.get_virt_addr() + PACKET_SIZE - 4) = seq_num++;
        }

        dev->tx_batch(0, buffer);

        // don't poll the time unnecessarily
        if ((counter++ & 0xfff) == 0) {
            auto time = monotonic_time();
            if (time - last_stats_printed > 1000 * 1000 * 1000) {
                // every second
                dev->read_stats(stats1);
                stats1_old.print_stats_diff(stats1, time - last_stats_printed);
                stats1_old = stats1;

                last_stats_printed = time;
            }
        }

        buffer.clear();
    }
}